

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instrument_zone.cpp
# Opt level: O0

void __thiscall
sf2cute::SFInstrumentZone::SFInstrumentZone
          (SFInstrumentZone *this,weak_ptr<sf2cute::SFSample> *sample)

{
  weak_ptr<sf2cute::SFSample> *sample_local;
  SFInstrumentZone *this_local;
  
  SFZone::SFZone(&this->super_SFZone);
  (this->super_SFZone)._vptr_SFZone = (_func_int **)&PTR__SFInstrumentZone_00163750;
  std::weak_ptr<sf2cute::SFSample>::weak_ptr(&this->sample_,sample);
  this->parent_instrument_ = (SFInstrument *)0x0;
  return;
}

Assistant:

SFInstrumentZone::SFInstrumentZone(std::weak_ptr<SFSample> sample) :
    sample_(std::move(sample)),
    parent_instrument_(nullptr) {
}